

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

reverse_iterator * __thiscall
immutable::vector<int,_false,_6>::rbegin
          (reverse_iterator *__return_storage_ptr__,vector<int,_false,_6> *this)

{
  vector_iterator<int,_false,_6> local_30;
  
  vector_iterator<int,_false,_6>::vector_iterator(&local_30);
  (__return_storage_ptr__->current)._impl.ptr = local_30._impl.ptr;
  if (local_30._impl.ptr != (rrb<int,_false,_6> *)0x0) {
    (local_30._impl.ptr)->_ref_count = (local_30._impl.ptr)->_ref_count + 1;
  }
  (__return_storage_ptr__->current)._cursor.
  super__Tuple_impl<0UL,_const_int_*,_unsigned_int,_unsigned_int>.
  super__Head_base<0UL,_const_int_*,_false>._M_head_impl =
       local_30._cursor.super__Tuple_impl<0UL,_const_int_*,_unsigned_int,_unsigned_int>.
       super__Head_base<0UL,_const_int_*,_false>._M_head_impl;
  (__return_storage_ptr__->current)._index = local_30._index;
  *(undefined4 *)&(__return_storage_ptr__->current).field_0xc = local_30._12_4_;
  (__return_storage_ptr__->current)._cursor.
  super__Tuple_impl<0UL,_const_int_*,_unsigned_int,_unsigned_int>.
  super__Tuple_impl<1UL,_unsigned_int,_unsigned_int> =
       local_30._cursor.super__Tuple_impl<0UL,_const_int_*,_unsigned_int,_unsigned_int>.
       super__Tuple_impl<1UL,_unsigned_int,_unsigned_int>;
  ref<immutable::rrb<int,_false,_6>_>::~ref(&local_30._impl);
  return __return_storage_ptr__;
}

Assistant:

reverse_iterator rbegin() const 
        { 
        return reverse_iterator{ end() }; 
        }